

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_frame.c
# Opt level: O2

size_t nghttp3_frame_write_settings_len(int64_t *ppayloadlen,nghttp3_frame_settings *fr)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  long n;
  uint64_t *puVar4;
  
  puVar4 = &fr->iv[0].value;
  n = 0;
  for (uVar3 = 0; uVar3 < fr->niv; uVar3 = uVar3 + 1) {
    sVar1 = nghttp3_put_varintlen(((nghttp3_settings_entry *)(puVar4 + -1))->id);
    sVar2 = nghttp3_put_varintlen(*puVar4);
    n = sVar1 + n + sVar2;
    puVar4 = puVar4 + 2;
  }
  *ppayloadlen = n;
  sVar1 = nghttp3_put_varintlen(4);
  sVar2 = nghttp3_put_varintlen(n);
  return sVar2 + n + sVar1;
}

Assistant:

size_t nghttp3_frame_write_settings_len(int64_t *ppayloadlen,
                                        const nghttp3_frame_settings *fr) {
  size_t payloadlen = 0;
  size_t i;

  for (i = 0; i < fr->niv; ++i) {
    payloadlen += nghttp3_put_varintlen((int64_t)fr->iv[i].id) +
                  nghttp3_put_varintlen((int64_t)fr->iv[i].value);
  }

  *ppayloadlen = (int64_t)payloadlen;

  return nghttp3_put_varintlen(NGHTTP3_FRAME_SETTINGS) +
         nghttp3_put_varintlen((int64_t)payloadlen) + payloadlen;
}